

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O3

void __thiscall
FIX::double_conversion::RoundUp
          (double_conversion *this,Vector<char> buffer,int *length,int *decimal_point)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  
  puVar2 = buffer._8_8_;
  uVar1 = *puVar2;
  iVar4 = (int)buffer.start_;
  if ((ulong)uVar1 == 0) {
    if (iVar4 < 1) goto LAB_0016ed71;
    *this = (double_conversion)0x31;
    *length = 1;
    *puVar2 = 1;
  }
  else {
    if (((int)uVar1 < 1) || (iVar4 < (int)uVar1)) {
LAB_0016ed71:
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
    }
    this[(ulong)uVar1 - 1] = (double_conversion)((char)this[(ulong)uVar1 - 1] + '\x01');
    uVar1 = *puVar2;
    if (1 < (long)(int)uVar1) {
      uVar3 = (long)(int)uVar1 + 1;
      do {
        if (iVar4 < (int)uVar1) goto LAB_0016ed71;
        if (this[uVar3 - 2] != (double_conversion)0x3a) {
          return;
        }
        this[uVar3 - 2] = (double_conversion)0x30;
        this[uVar3 - 3] = (double_conversion)((char)this[uVar3 - 3] + '\x01');
        uVar3 = uVar3 - 1;
      } while (2 < uVar3);
    }
    if (*this == (double_conversion)0x3a) {
      *this = (double_conversion)0x31;
      *length = *length + 1;
    }
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}